

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall
ON_MeshComponentRef::GetBBox(ON_MeshComponentRef *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  int iVar1;
  ON_Mesh *this_00;
  ON_MeshTopologyEdge *pOVar2;
  ON_MeshTopologyVertex *pOVar3;
  uint *puVar4;
  ON_MeshFace *pOVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  ON_MeshNgon *pOVar9;
  ON_MeshTopology *pOVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ON_3dPoint *this_01;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ON_MeshFace *pOVar18;
  uint uVar19;
  double dVar20;
  bool local_1f0;
  uint vdex_buffer [2];
  ON_3dPointListRef vertex_list;
  ON_3dPoint v [16];
  
  this_00 = this->m_mesh;
  uVar19 = 0;
  if (this_00 == (ON_Mesh *)0x0) {
    return false;
  }
  switch((this->m_mesh_ci).m_type) {
  case mesh_vertex:
    uVar8 = (this->m_mesh_ci).m_index;
LAB_00516300:
    if ((int)uVar8 < 0) break;
    uVar19 = 1;
    vdex_buffer[0] = uVar8;
    goto switchD_005162f9_default;
  case meshtop_vertex:
    if ((((-1 < (this->m_mesh_ci).m_index) &&
         (pOVar10 = MeshTopology(this), pOVar10 != (ON_MeshTopology *)0x0)) &&
        (iVar16 = (this->m_mesh_ci).m_index, iVar16 < (pOVar10->m_topv).m_count)) &&
       ((pOVar3 = (pOVar10->m_topv).m_a, 0 < pOVar3[iVar16].m_v_count &&
        (puVar4 = (uint *)pOVar3[iVar16].m_vi, puVar4 != (uint *)0x0)))) {
      uVar8 = *puVar4;
      goto LAB_00516300;
    }
    break;
  case meshtop_edge:
    if (((-1 < (this->m_mesh_ci).m_index) &&
        (pOVar10 = MeshTopology(this), pOVar10 != (ON_MeshTopology *)0x0)) &&
       (iVar16 = (this->m_mesh_ci).m_index, iVar16 < (pOVar10->m_tope).m_count)) {
      pOVar2 = (pOVar10->m_tope).m_a;
      pOVar18 = (ON_MeshFace *)0x0;
      lVar11 = 0;
      uVar13 = 0;
      do {
        iVar1 = pOVar2[iVar16].m_topvi[lVar11];
        lVar14 = (long)iVar1;
        uVar17 = uVar13;
        if (((-1 < lVar14) && (iVar1 < (pOVar10->m_topv).m_count)) &&
           ((pOVar3 = (pOVar10->m_topv).m_a, 0 < pOVar3[lVar14].m_v_count &&
            ((puVar4 = (uint *)pOVar3[lVar14].m_vi, puVar4 != (uint *)0x0 &&
             (uVar19 = *puVar4, -1 < (int)uVar19)))))) {
          uVar17 = (ulong)((int)uVar13 + 1);
          vdex_buffer[uVar13] = uVar19;
        }
        uVar19 = (uint)uVar17;
        lVar11 = lVar11 + 1;
        uVar13 = uVar17;
      } while (lVar11 == 1);
      goto LAB_00516442;
    }
    break;
  case mesh_face:
    iVar16 = (this->m_mesh_ci).m_index;
    lVar11 = (long)iVar16;
    if ((-1 < lVar11) && (iVar16 < (this_00->m_F).m_count)) {
      pOVar5 = (this_00->m_F).m_a;
      pOVar18 = pOVar5 + lVar11;
      uVar19 = (pOVar5[lVar11].vi[2] != pOVar5[lVar11].vi[3]) + 3;
      goto LAB_00516442;
    }
    break;
  case mesh_ngon:
    pOVar9 = ON_Mesh::Ngon(this_00,(this->m_mesh_ci).m_index);
    if ((pOVar9 != (ON_MeshNgon *)0x0) && (uVar19 = pOVar9->m_Vcount, uVar19 != 0)) {
      pOVar18 = (ON_MeshFace *)pOVar9->m_vi;
      if (pOVar18 == (ON_MeshFace *)0x0) {
        uVar19 = 0;
      }
      goto LAB_00516442;
    }
    break;
  default:
    goto switchD_005162f9_default;
  }
  uVar19 = 0;
switchD_005162f9_default:
  pOVar18 = (ON_MeshFace *)0x0;
LAB_00516442:
  if (pOVar18 == (ON_MeshFace *)0x0) {
    if (uVar19 == 0) {
      return false;
    }
    pOVar18 = (ON_MeshFace *)vdex_buffer;
  }
  ON_3dPointListRef::ON_3dPointListRef(&vertex_list,this->m_mesh);
  uVar8 = vertex_list.m_point_count;
  if (uVar19 == 0) {
    local_1f0 = false;
    iVar16 = 0;
  }
  else {
    uVar13 = 0;
    uVar17 = 0;
    local_1f0 = false;
    do {
      uVar15 = pOVar18->vi[uVar13];
      if (uVar15 < uVar8) {
        this_01 = v + uVar17;
        if (uVar15 < vertex_list.m_point_count) {
          if (vertex_list.m_dP == (double *)0x0) {
            uVar12 = (ulong)(uVar15 * vertex_list.m_point_stride);
            this_01->x = (double)vertex_list.m_fP[uVar12];
            v[uVar17].y = (double)vertex_list.m_fP[uVar12 + 1];
            dVar20 = (double)vertex_list.m_fP[uVar12 + 2];
          }
          else {
            uVar12 = (ulong)(uVar15 * vertex_list.m_point_stride);
            this_01->x = vertex_list.m_dP[uVar12];
            v[uVar17].y = vertex_list.m_dP[uVar12 + 1];
            dVar20 = vertex_list.m_dP[uVar12 + 2];
          }
          v[uVar17].z = dVar20;
        }
        else {
          v[uVar17].z = -1.23432101234321e+308;
          v[uVar17].y = -1.23432101234321e+308;
          this_01->x = -1.23432101234321e+308;
        }
        bVar6 = ON_3dPoint::IsValid(this_01);
        if ((bVar6) && (uVar15 = (int)uVar17 + 1, uVar17 = (ulong)uVar15, uVar15 == 0x10)) {
          uVar17 = 0;
          bVar6 = ON_GetPointListBoundingBox
                            (3,false,0x10,3,&v[0].x,boxmin,boxmax,(uint)(bGrowBox & 1));
          if (bVar6) {
            local_1f0 = true;
            bGrowBox = true;
          }
        }
      }
      iVar16 = (int)uVar17;
      uVar13 = uVar13 + 1;
    } while (uVar19 != uVar13);
  }
  bVar6 = local_1f0;
  if (iVar16 != 0) {
    bVar7 = ON_GetPointListBoundingBox(3,false,iVar16,3,&v[0].x,boxmin,boxmax,(uint)(bGrowBox & 1));
    bVar6 = true;
    if (!bVar7) {
      bVar6 = local_1f0;
    }
  }
  return bVar6;
}

Assistant:

bool ON_MeshComponentRef::GetBBox(
       double* boxmin,
       double* boxmax,
       bool bGrowBox
       ) const
{
  const unsigned int* vdex_list = 0;
  unsigned int vdex_count = 0;
  unsigned int vdex_buffer[2];

  if ( 0 == m_mesh )
    return false;

  switch(m_mesh_ci.m_type)
  {
  case ON_COMPONENT_INDEX::mesh_vertex:
    if (m_mesh_ci.m_index >= 0)
      vdex_buffer[vdex_count++] = (unsigned int)m_mesh_ci.m_index;
    break;

  case ON_COMPONENT_INDEX::meshtop_vertex:
    if ( m_mesh_ci.m_index >= 0 )
    {
      const ON_MeshTopology* top = MeshTopology();
      if ( 0 != top && m_mesh_ci.m_index < top->m_topv.Count())
      {
        const ON_MeshTopologyVertex& v = top->m_topv[m_mesh_ci.m_index];
        if ( v.m_v_count > 0 && 0 != v.m_vi && v.m_vi[0] >= 0 )
          vdex_buffer[vdex_count++] = (unsigned int)v.m_vi[0];
      }
    }
    break;

  case ON_COMPONENT_INDEX::meshtop_edge:
    if ( m_mesh_ci.m_index >= 0 )
    {
      const ON_MeshTopology* top = MeshTopology();
      if ( 0 != top && m_mesh_ci.m_index < top->m_tope.Count())
      {
        const ON_MeshTopologyEdge& e = top->m_tope[m_mesh_ci.m_index];
        for ( unsigned int j = 0; j < 2; j++ )
        {
          if ( e.m_topvi[j] >= 0 && e.m_topvi[j] < top->m_topv.Count() )
          {
            const ON_MeshTopologyVertex& v = top->m_topv[e.m_topvi[j]];
            if ( v.m_v_count > 0 && 0 != v.m_vi && v.m_vi[0] >= 0 )
            {
              vdex_buffer[vdex_count++] = (unsigned int)v.m_vi[0];
            }
          }
        }
      }
    }
    break;

  case ON_COMPONENT_INDEX::mesh_face:
    if (m_mesh_ci.m_index >= 0 && m_mesh_ci.m_index < m_mesh->m_F.Count())
    {
      vdex_list = (const unsigned int*)(m_mesh->m_F[m_mesh_ci.m_index].vi);
      vdex_count = (vdex_list[2] == vdex_list[3]) ? 3 : 4;
    }
    break;

  case ON_COMPONENT_INDEX::mesh_ngon:
    {
      const ON_MeshNgon* ngon = m_mesh->Ngon(m_mesh_ci.m_index);
      if ( ngon && ngon->m_Vcount > 0 && 0 != ngon->m_vi )
      {
        vdex_list = ngon->m_vi;
        vdex_count = ngon->m_Vcount;
      }
    }
    break;

  default:
    break;
  }

  if ( 0 == vdex_list )
  {
    if ( 0 == vdex_count )
      return 0;
    vdex_list = vdex_buffer;
  }

  bool rc = false;
  const ON_3dPointListRef vertex_list(m_mesh);
  const unsigned int vertex_count = vertex_list.PointCount();
  ON_3dPoint v[16];
  const unsigned int v_capacity = (unsigned int)(sizeof(v)/sizeof(v[0]));
  unsigned int v_count = 0;
  for ( unsigned int i = 0; i < vdex_count; i++ )
  {
    if ( vdex_list[i] < vertex_count )
    {
      vertex_list.GetPoint(vdex_list[i],&v[v_count].x);
      if ( v[v_count].IsValid() )
      {
        v_count++;
        if ( v_capacity == v_count )
        {
          if ( ON_GetPointListBoundingBox( 3, 0, v_count, 3, &v[0].x, boxmin, boxmax, bGrowBox?true:false ) )
          {
            bGrowBox = true;
            rc = true;
          }
          v_count = 0;
        }
      }
    }
  }

  if ( v_count > 0 )
  {
    if ( ON_GetPointListBoundingBox( 3, 0, v_count, 3, &v[0].x, boxmin, boxmax, bGrowBox?true:false ) )
      rc = true;
    v_count = 0;
  }

  return rc;
}